

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O3

bool __thiscall BGParseManager::DiscardParseResults(BGParseManager *this,DWORD cookie,void *buffer)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  BGParseWorkItem *this_00;
  undefined4 *puVar4;
  bool bVar5;
  Tick local_38;
  Tick now;
  
  this_00 = FindJob(this,cookie,false,true);
  bVar5 = true;
  if (this_00 != (BGParseWorkItem *)0x0) {
    if (this_00->script != (byte *)buffer) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BGParseManager.cpp"
                         ,0x13c,"(buffer == workitem->GetScriptSrc())",
                         "buffer == workitem->GetScriptSrc()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    if (this_00->discarded == false) {
      BGParseWorkItem::~BGParseWorkItem(this_00);
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_00,0xd0);
    }
    else {
      bVar5 = false;
    }
  }
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BgParsePhase);
  if (bVar2) {
    local_38 = Js::Tick::Now();
    DVar3 = GetCurrentThreadId();
    Js::Tick::ToMilliseconds(&local_38);
    Output::Print(L"[BgParse: Discard -- cookie: %04d on thread 0x%X at %.2f ms, workitem: 0x%p, workitem owns buffer: %u]\n"
                  ,cookie,(ulong)DVar3,this_00,(ulong)(bVar5 ^ 1));
  }
  return bVar5;
}

Assistant:

bool BGParseManager::DiscardParseResults(DWORD cookie, void* buffer)
{
    BGParseWorkItem* workitem = FindJob(cookie, false /*waitForResults*/, true /*removeJob*/);
    bool callerOwnsSourceBuffer = true;
    if (workitem != nullptr)
    {
        Assert(buffer == workitem->GetScriptSrc());

        if (!workitem->IsDiscarded())
        {
            HeapDelete(workitem);
        }
        else
        {
            callerOwnsSourceBuffer = false;
        }
    }

    if (PHASE_TRACE1(Js::BgParsePhase))
    {
        Js::Tick now = Js::Tick::Now();
        Output::Print(
            _u("[BgParse: Discard -- cookie: %04d on thread 0x%X at %.2f ms, workitem: 0x%p, workitem owns buffer: %u]\n"),
            cookie,
            ::GetCurrentThreadId(),
            now.ToMilliseconds(),
            workitem,
            !callerOwnsSourceBuffer
        );
    }

    return callerOwnsSourceBuffer;
}